

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O2

void __thiscall zmq::session_base_t::write_activated(session_base_t *this)

{
  pipe_t *in_RSI;
  
  write_activated((session_base_t *)(this[-1].super_own_t.options.routing_id + 0x57),in_RSI);
  return;
}

Assistant:

void zmq::session_base_t::write_activated (pipe_t *pipe_)
{
    // Skip activating if we're detaching this pipe
    if (_pipe != pipe_) {
        zmq_assert (_terminating_pipes.count (pipe_) == 1);
        return;
    }

    if (_engine)
        _engine->restart_input ();
}